

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

void GvEv(PDISASM pMyDisasm)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (pMyDisasm->Reserved_).OperandSize;
  uVar2 = 0x68;
  if (iVar1 != 0x40) {
    uVar2 = iVar1 == 0x20 | 0x66;
  }
  (pMyDisasm->Reserved_).MemDecoration = uVar2;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ GvEv(PDISASM pMyDisasm)
{
  if (GV.OperandSize == 64) {
    GV.MemDecoration = Arg2qword;
  }
  else if (GV.OperandSize == 32) {
    GV.MemDecoration = Arg2dword;
  }
  else {
    GV.MemDecoration = Arg2word;
  }
  decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
}